

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QGraphicsView::drawForeground(QGraphicsView *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
      (*(long *)(lVar1 + 0x498) != 0)) && (*(int *)(*(long *)(lVar1 + 0x4e8) + 4) == 0)) {
    (**(code **)(**(long **)(lVar1 + 0x498) + 0xf0))();
    return;
  }
  QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }